

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

bool __thiscall
Js::Phases::IsEnabled(Phases *this,Phase phase,uint sourceContextId,LocalFunctionId functionId)

{
  bool bVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  SourceFunctionNode n;
  
  uVar2 = (ulong)(uint)((int)CONCAT62(in_register_00000032,phase) << 5);
  if ((&this->phaseList[0].valid)[uVar2] == true) {
    n.functionId = functionId;
    n.sourceContextId = sourceContextId;
    bVar1 = RangeBase<Js::SourceFunctionNode>::InRange
                      ((RangeBase<Js::SourceFunctionNode> *)
                       ((long)&this->phaseList[0].range.super_RangeBase<Js::SourceFunctionNode>.
                               range.
                               super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
                               .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next + uVar2),n);
    return bVar1;
  }
  return false;
}

Assistant:

bool
    Phases::IsEnabled(Phase phase, uint sourceContextId, Js::LocalFunctionId functionId)
    {
        return  this->phaseList[(int)phase].valid &&
                this->phaseList[(int)phase].range.InRange(SourceFunctionNode(sourceContextId, functionId));
    }